

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O1

bool __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
::MergePartialFromCodedStream
          (MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
           *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  Arena *this_00;
  uint8 *puVar3;
  bool bVar4;
  uint32 tag;
  CustomLayerParams_CustomLayerParamValue *pCVar5;
  pair<int,_int> pVar6;
  uint32 first_byte_or_zero;
  int byte_limit;
  
LAB_004ca753:
  do {
    pbVar2 = input->buffer_;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      tag = (uint32)bVar1;
      first_byte_or_zero = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_004ca76e;
      input->buffer_ = pbVar2 + 1;
    }
    else {
      first_byte_or_zero = 0;
LAB_004ca76e:
      tag = io::CodedInputStream::ReadTagFallback(input,first_byte_or_zero);
    }
    if (tag == 10) {
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
      if ((this->key_).ptr_ == (string *)&fixed_address_empty_string_abi_cxx11_) {
        ArenaStringPtr::CreateInstance
                  (&this->key_,this->arena_,(string *)&fixed_address_empty_string_abi_cxx11_);
      }
      bVar4 = WireFormatLite::ReadBytes(input,(this->key_).ptr_);
      if (!bVar4) {
        return false;
      }
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (*puVar3 == '\x12')) {
        input->buffer_ = puVar3 + 1;
LAB_004ca809:
        *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
        if (this->value_ == (ValueOnMemory)0x0) {
          this_00 = this->arena_;
          if (this_00 == (Arena *)0x0) {
            pCVar5 = (CustomLayerParams_CustomLayerParamValue *)operator_new(0x20);
            CoreML::Specification::CustomLayerParams_CustomLayerParamValue::
            CustomLayerParams_CustomLayerParamValue(pCVar5);
          }
          else {
            pCVar5 = (CustomLayerParams_CustomLayerParamValue *)
                     Arena::AllocateAligned
                               (this_00,(type_info *)
                                        &CoreML::Specification::
                                         CustomLayerParams_CustomLayerParamValue::typeinfo,0x20);
            CoreML::Specification::CustomLayerParams_CustomLayerParamValue::
            CustomLayerParams_CustomLayerParamValue(pCVar5);
            Arena::AddListNode(this_00,pCVar5,
                               arena_destruct_object<CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
                              );
          }
          this->value_ = pCVar5;
        }
        pCVar5 = this->value_;
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (byte_limit = (int)(char)*puVar3, -1 < (char)*puVar3))
        {
          input->buffer_ = puVar3 + 1;
          bVar4 = true;
        }
        else {
          byte_limit = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          bVar4 = -1 < byte_limit;
        }
        if ((((!bVar4) ||
             (pVar6 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,byte_limit),
             (long)pVar6 < 0)) ||
            (bVar4 = CoreML::Specification::CustomLayerParams_CustomLayerParamValue::
                     MergePartialFromCodedStream(pCVar5,input), !bVar4)) ||
           (bVar4 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar6.first),
           !bVar4)) {
          return false;
        }
        *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
        if ((input->buffer_ == input->buffer_end_) &&
           ((input->buffer_size_after_limit_ != 0 ||
            (input->total_bytes_read_ == input->current_limit_)))) {
          input->last_tag_ = 0;
          input->legitimate_message_end_ = true;
          return true;
        }
      }
      goto LAB_004ca753;
    }
    if (tag == 0x12) goto LAB_004ca809;
    if (tag == 0) {
      return true;
    }
    if ((tag & 7) == 4) {
      return true;
    }
    bVar4 = WireFormatLite::SkipField(input,tag);
    if (!bVar4) {
      return false;
    }
  } while( true );
}

Assistant:

bool MergePartialFromCodedStream(::google::protobuf::io::CodedInputStream* input) {
    uint32 tag;

    for (;;) {
      // 1) corrupted data: return false;
      // 2) unknown field: skip without putting into unknown field set;
      // 3) unknown enum value: keep it in parsing. In proto2, caller should
      // check the value and put this entry into containing message's unknown
      // field set if the value is an unknown enum. In proto3, caller doesn't
      // need to care whether the value is unknown enum;
      // 4) missing key/value: missed key/value will have default value. caller
      // should take this entry as if key/value is set to default value.
      tag = input->ReadTagNoLastTag();
      switch (tag) {
        case kKeyTag:
          if (!KeyTypeHandler::Read(input, mutable_key())) {
            return false;
          }
          set_has_key();
          if (!input->ExpectTag(kValueTag)) break;
          GOOGLE_FALLTHROUGH_INTENDED;

        case kValueTag:
          if (!ValueTypeHandler::Read(input, mutable_value())) {
            return false;
          }
          set_has_value();
          if (input->ExpectAtEnd()) return true;
          break;

        default:
          if (tag == 0 ||
              WireFormatLite::GetTagWireType(tag) ==
              WireFormatLite::WIRETYPE_END_GROUP) {
            return true;
          }
          if (!WireFormatLite::SkipField(input, tag)) return false;
          break;
      }
    }
  }